

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItemEx(char *label,char *icon,char *shortcut,bool selected,bool enabled)

{
  float fVar1;
  ImDrawList *draw_list;
  ImGuiContext *pIVar2;
  ImU32 col;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  float local_128;
  float local_124;
  ImVec2 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  ImVec2 local_ec;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  float local_b4;
  float local_b0;
  float stretch_w;
  float min_w;
  float checkmark_w;
  float local_a0;
  float fStack_9c;
  float shortcut_w;
  float local_94;
  ImVec2 IStack_90;
  float icon_w;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 text_pos;
  float w;
  ImGuiMenuColumns *offsets;
  ImGuiSelectableFlags flags;
  bool pressed;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool enabled_local;
  bool selected_local;
  char *shortcut_local;
  char *icon_local;
  char *label_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    label_size = (pIVar3->DC).CursorPos;
    IVar4 = CalcTextSize(label,(char *)0x0,true,-1.0);
    PushID(label);
    if (!enabled) {
      BeginDisabled(true);
    }
    register0x00000000 = &(pIVar3->DC).MenuColumns;
    flags = (ImGuiSelectableFlags)IVar4.x;
    if ((pIVar3->DC).LayoutType == 0) {
      text_pos.x = (float)flags;
      (pIVar3->DC).CursorPos.x =
           (pIVar3->DC).CursorPos.x + (float)(int)((pIVar2->Style).ItemSpacing.x * 0.5);
      ImVec2::ImVec2(&local_74,
                     (pIVar3->DC).CursorPos.x + (float)(pIVar3->DC).MenuColumns.OffsetLabel,
                     (pIVar3->DC).CursorPos.y + (pIVar3->DC).CurrLineTextBaseOffset);
      fVar1 = (pIVar2->Style).ItemSpacing.x;
      ImVec2::ImVec2(&local_7c,fVar1 + fVar1,(pIVar2->Style).ItemSpacing.y);
      PushStyleVar(0xe,&local_7c);
      ImVec2::ImVec2(&local_84,text_pos.x,0.0);
      offsets._7_1_ = Selectable("",selected,0x4800000,&local_84);
      PopStyleVar(1);
      IStack_90 = local_74;
      RenderText(local_74,label,(char *)0x0,true);
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar2->Style).ItemSpacing.x * -0.5) + (pIVar3->DC).CursorPos.x;
    }
    else {
      if ((icon == (char *)0x0) || (*icon == '\0')) {
        local_124 = 0.0;
      }
      else {
        _fStack_9c = CalcTextSize(icon,(char *)0x0,false,-1.0);
        local_124 = fStack_9c;
      }
      local_94 = local_124;
      if ((shortcut == (char *)0x0) || (*shortcut == '\0')) {
        local_128 = 0.0;
      }
      else {
        _min_w = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
        local_128 = min_w;
      }
      local_a0 = local_128;
      stretch_w = (float)(int)(pIVar2->FontSize * 1.2);
      local_b0 = ImGuiMenuColumns::DeclColumns
                           (&(pIVar3->DC).MenuColumns,local_94,(float)flags,local_128,stretch_w);
      local_bc = GetContentRegionAvail();
      local_b4 = ImMax<float>(0.0,local_bc.x - local_b0);
      ImVec2::ImVec2(&local_c4,local_b0,0.0);
      offsets._7_1_ = Selectable("",false,0x5800000,&local_c4);
      ImVec2::ImVec2(&local_d4,(float)stack0xffffffffffffff98->OffsetLabel,0.0);
      local_cc = operator+(&label_size,&local_d4);
      RenderText(local_cc,label,(char *)0x0,true);
      if (0.0 < local_94) {
        ImVec2::ImVec2(&local_e4,(float)stack0xffffffffffffff98->OffsetIcon,0.0);
        local_dc = operator+(&label_size,&local_e4);
        RenderText(local_dc,icon,(char *)0x0,true);
      }
      if (0.0 < local_a0) {
        PushStyleColor(0,(pIVar2->Style).Colors + 1);
        ImVec2::ImVec2(&local_f4,(float)stack0xffffffffffffff98->OffsetShortcut + local_b4,0.0);
        local_ec = operator+(&label_size,&local_f4);
        RenderText(local_ec,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        draw_list = pIVar3->DrawList;
        ImVec2::ImVec2(&local_104,
                       pIVar2->FontSize * 0.4 +
                       (float)stack0xffffffffffffff98->OffsetMark + local_b4,
                       pIVar2->FontSize * 0.134 * 0.5);
        local_fc = operator+(&label_size,&local_104);
        col = GetColorU32(0,1.0);
        RenderCheckMark(draw_list,local_fc,col,pIVar2->FontSize * 0.866);
      }
    }
    if (!enabled) {
      EndDisabled();
    }
    PopID();
    label_local._7_1_ = offsets._7_1_;
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::MenuItemEx(const char* label, const char* icon, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // We've been using the equivalent of ImGuiSelectableFlags_SetNavIdOnHover on all Selectable() since early Nav system days (commit 43ee5d73),
    // but I am unsure whether this should be kept at all. For now moved it to be an opt-in feature used by menus only.
    bool pressed;
    PushID(label);
    if (!enabled)
        BeginDisabled();
    const ImGuiSelectableFlags flags = ImGuiSelectableFlags_SelectOnRelease | ImGuiSelectableFlags_SetNavIdOnHover;
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation: we don't render the shortcut, we render a highlight instead of the selected tick mark.
        float w = label_size.x;
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        pressed = Selectable("", selected, flags, ImVec2(w, 0.0f));
        PopStyleVar();
        RenderText(text_pos, label);
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu item inside a vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float shortcut_w = (shortcut && shortcut[0]) ? CalcTextSize(shortcut, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, shortcut_w, checkmark_w); // Feedback for next frame
        float stretch_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable("", false, flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        RenderText(pos + ImVec2(offsets->OffsetLabel, 0.0f), label);
        if (icon_w > 0.0f)
            RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
        if (shortcut_w > 0.0f)
        {
            PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
            RenderText(pos + ImVec2(offsets->OffsetShortcut + stretch_w, 0.0f), shortcut, NULL, false);
            PopStyleColor();
        }
        if (selected)
            RenderCheckMark(window->DrawList, pos + ImVec2(offsets->OffsetMark + stretch_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(ImGuiCol_Text), g.FontSize  * 0.866f);
    }
    IMGUI_TEST_ENGINE_ITEM_INFO(g.LastItemData.ID, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    if (!enabled)
        EndDisabled();
    PopID();

    return pressed;
}